

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void formatGraphicsItemHelper(QDebug *debug,QGraphicsItem *item)

{
  double dVar1;
  QGraphicsItem *t;
  QDebug *pQVar2;
  QGraphicsItemPrivate *pQVar3;
  long in_FS_OFFSET;
  QDebug local_30;
  undefined1 local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  t = ((item->d_ptr).d)->parent;
  if (t != (QGraphicsItem *)0x0) {
    pQVar2 = QDebug::operator<<(debug,", parent=");
    QDebug::operator<<(pQVar2,t);
  }
  QDebug::operator<<(debug,", pos=");
  pQVar3 = (item->d_ptr).d;
  dVar1 = (pQVar3->pos).yp;
  pQVar2 = QDebug::operator<<(debug,(pQVar3->pos).xp);
  pQVar2 = QDebug::operator<<(pQVar2,',');
  QDebug::operator<<(pQVar2,dVar1);
  pQVar3 = (item->d_ptr).d;
  dVar1 = pQVar3->z;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    pQVar2 = QDebug::operator<<(debug,", z=");
    QDebug::operator<<(pQVar2,dVar1);
    pQVar3 = (item->d_ptr).d;
  }
  if ((*(uint *)&pQVar3->field_0x163 & 0xfffff00) != 0) {
    pQVar2 = QDebug::operator<<(debug,", flags=");
    local_30.stream = pQVar2->stream;
    *(int *)(local_30.stream + 0x28) = *(int *)(local_30.stream + 0x28) + 1;
    operator<<((Stream *)local_28,
               (QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>)SUB84(&local_30,0));
    QDebug::~QDebug((QDebug *)local_28);
    QDebug::~QDebug(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void formatGraphicsItemHelper(QDebug debug, const QGraphicsItem *item)
{
    if (const QGraphicsItem *parent = item->parentItem())
          debug << ", parent=" << static_cast<const void *>(parent);
    debug << ", pos=";
    QtDebugUtils::formatQPoint(debug, item->pos());
    if (const qreal z = item->zValue())
        debug << ", z=" << z;
    if (item->flags())
        debug <<  ", flags=" << item->flags();
}